

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.hpp
# Opt level: O0

void __thiscall
pico_tree::internal::box_base<pico_tree::internal::box<double,2ul>>::
fit<pico_tree::internal::box<double,2ul>>
          (box_base<pico_tree::internal::box<double,_2UL>_> *this,
          box_base<pico_tree::internal::box<double,_2UL>_> *x)

{
  double dVar1;
  scalar_type sVar2;
  box<double,_2UL> *this_00;
  size_type sVar3;
  scalar_type *psVar4;
  box_base<pico_tree::internal::box<double,_2UL>_> *in_RDI;
  size_type i;
  scalar_type in_stack_ffffffffffffffb8;
  box_base<pico_tree::internal::box<double,_2UL>_> *in_stack_ffffffffffffffc0;
  undefined8 local_18;
  
  local_18 = 0;
  while( true ) {
    this_00 = box_base<pico_tree::internal::box<double,_2UL>_>::derived(in_RDI);
    sVar3 = box<double,_2UL>::size(this_00);
    if (sVar3 <= local_18) break;
    psVar4 = box_base<pico_tree::internal::box<double,_2UL>_>::min
                       (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
    dVar1 = *psVar4;
    psVar4 = box_base<pico_tree::internal::box<double,_2UL>_>::min
                       (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
    if (dVar1 < *psVar4) {
      psVar4 = box_base<pico_tree::internal::box<double,_2UL>_>::min
                         (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
      sVar2 = *psVar4;
      psVar4 = box_base<pico_tree::internal::box<double,_2UL>_>::min
                         (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
      *psVar4 = sVar2;
    }
    psVar4 = box_base<pico_tree::internal::box<double,_2UL>_>::max
                       (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffc0 = (box_base<pico_tree::internal::box<double,_2UL>_> *)*psVar4;
    psVar4 = box_base<pico_tree::internal::box<double,_2UL>_>::max
                       (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
    if (*psVar4 <= (double)in_stack_ffffffffffffffc0 && (double)in_stack_ffffffffffffffc0 != *psVar4
       ) {
      psVar4 = box_base<pico_tree::internal::box<double,_2UL>_>::max
                         (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
      in_stack_ffffffffffffffb8 = *psVar4;
      psVar4 = box_base<pico_tree::internal::box<double,_2UL>_>::max
                         (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
      *psVar4 = in_stack_ffffffffffffffb8;
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

constexpr void fit(box_base<OtherDerived_> const& x) {
    for (size_type i = 0; i < derived().size(); ++i) {
      if (x.min(i) < min(i)) {
        min(i) = x.min(i);
      }

      if (x.max(i) > max(i)) {
        max(i) = x.max(i);
      }
    }
  }